

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shader.cpp
# Opt level: O0

void __thiscall sf::Shader::Shader(Shader *this)

{
  Shader *this_local;
  
  GlResource::GlResource((GlResource *)this);
  NonCopyable::NonCopyable((NonCopyable *)this);
  this->m_shaderProgram = 0;
  this->m_currentTexture = -1;
  memset(&this->m_textures,0,0x30);
  std::
  map<int,_const_sf::Texture_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_sf::Texture_*>_>_>
  ::map(&this->m_textures);
  memset(&this->m_uniforms,0,0x30);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::map(&this->m_uniforms);
  return;
}

Assistant:

Shader::Shader() :
m_shaderProgram (0),
m_currentTexture(-1),
m_textures      (),
m_uniforms      ()
{
}